

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_conv_1d_dw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int p0,int d0)

{
  ggml_tensor *pgVar1;
  ggml_tensor *a_00;
  ggml_tensor *ctx_00;
  ggml_tensor *ne1;
  undefined4 in_ECX;
  undefined4 in_R8D;
  undefined4 in_R9D;
  _Bool in_stack_00000013;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  ggml_tensor *in_stack_00000020;
  ggml_tensor *in_stack_00000028;
  ggml_tensor *result;
  ggml_tensor *im2col;
  ggml_tensor *new_b;
  ggml_tensor *new_a;
  int in_stack_00000050;
  ggml_tensor *in_stack_ffffffffffffffb0;
  ggml_tensor *in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  int64_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  pgVar1 = ggml_reshape_4d((ggml_context *)CONCAT44(in_ECX,in_R8D),
                           (ggml_tensor *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
  a_00 = ggml_reshape_4d((ggml_context *)CONCAT44(in_ECX,in_R8D),
                         (ggml_tensor *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),(int64_t)pgVar1,
                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         (int64_t)in_stack_ffffffffffffffb8);
  ctx_00 = ggml_im2col((ggml_context *)result,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                       in_stack_00000018,in_stack_00000014,(int)new_b,(int)new_a,in_stack_00000050,
                       in_stack_00000013,(ggml_type)b);
  ne1 = ggml_mul_mat((ggml_context *)ctx_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pgVar1 = ggml_reshape_3d((ggml_context *)pgVar1,a_00,(int64_t)ctx_00,(int64_t)ne1,
                           (int64_t)in_stack_ffffffffffffffb0);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_conv_1d_dw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   p0,
        int                   d0) {
    struct ggml_tensor * new_a = ggml_reshape_4d(ctx, a, a->ne[0], 1, a->ne[1], a->ne[2]);
    struct ggml_tensor * new_b = ggml_reshape_4d(ctx, b, b->ne[0], 1, b->ne[1], b->ne[2]);

    struct ggml_tensor * im2col = ggml_im2col(ctx, new_a, new_b, s0, 0, p0, 0, d0, 0, false, GGML_TYPE_F16);

    struct ggml_tensor * result = ggml_mul_mat(ctx, im2col, a);

    result = ggml_reshape_3d(ctx, result, b->ne[0], b->ne[1], 1);

    return result;
}